

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O1

void ProtectNoBanConnections
               (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                *eviction_candidates)

{
  long lVar1;
  pointer pNVar2;
  pointer pNVar3;
  pointer pNVar4;
  pointer pNVar5;
  long lVar6;
  pointer pNVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar4 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = ((long)pNVar2 - (long)pNVar4 >> 3) * -0x71c71c71c71c71c7 >> 2;
  pNVar3 = pNVar4;
  if (0 < lVar6) {
    pNVar3 = pNVar4 + lVar6 * 4;
    lVar6 = lVar6 + 1;
    pNVar4 = pNVar4 + 2;
    do {
      if (pNVar4[-2].m_noban != false) {
        pNVar4 = pNVar4 + -2;
        goto LAB_00946b72;
      }
      if (pNVar4[-1].m_noban != false) {
        pNVar4 = pNVar4 + -1;
        goto LAB_00946b72;
      }
      if (pNVar4->m_noban != false) goto LAB_00946b72;
      if (pNVar4[1].m_noban != false) {
        pNVar4 = pNVar4 + 1;
        goto LAB_00946b72;
      }
      lVar6 = lVar6 + -1;
      pNVar4 = pNVar4 + 4;
    } while (1 < lVar6);
  }
  lVar6 = ((long)pNVar2 - (long)pNVar3 >> 3) * -0x71c71c71c71c71c7;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pNVar4 = pNVar2;
      if ((lVar6 != 3) || (pNVar4 = pNVar3, pNVar3->m_noban != false)) goto LAB_00946b72;
      pNVar3 = pNVar3 + 1;
    }
    pNVar4 = pNVar3;
    if (pNVar3->m_noban != false) goto LAB_00946b72;
    pNVar3 = pNVar3 + 1;
  }
  pNVar4 = pNVar3;
  if (pNVar3->m_noban == false) {
    pNVar4 = pNVar2;
  }
LAB_00946b72:
  pNVar3 = pNVar4 + 1;
  if (pNVar3 != pNVar2 && pNVar4 != pNVar2) {
    do {
      if (pNVar3->m_noban == false) {
        pNVar5 = pNVar3;
        pNVar7 = pNVar4;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          pNVar7->id = pNVar5->id;
          pNVar5 = (pointer)&pNVar5->m_connected;
          pNVar7 = (pointer)&pNVar7->m_connected;
        }
        pNVar4 = pNVar4 + 1;
      }
      pNVar3 = pNVar3 + 1;
    } while (pNVar3 != pNVar2);
  }
  pNVar2 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pNVar4 != pNVar2) &&
     (pNVar3 = (eviction_candidates->
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
               _M_impl.super__Vector_impl_data._M_finish,
     pNVar4 = (pointer)((long)pNVar4 + ((long)pNVar3 - (long)pNVar2)), pNVar3 != pNVar4)) {
    (eviction_candidates->
    super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
    super__Vector_impl_data._M_finish = pNVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ProtectNoBanConnections(std::vector<NodeEvictionCandidate>& eviction_candidates)
{
    eviction_candidates.erase(std::remove_if(eviction_candidates.begin(), eviction_candidates.end(),
                                             [](NodeEvictionCandidate const& n) {
                                                 return n.m_noban;
                                             }),
                              eviction_candidates.end());
}